

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz-test.cpp
# Opt level: O2

void __thiscall test_encode_decode_noise::test_method(test_encode_decode_noise *this)

{
  value_type vVar1;
  undefined8 extraout_RDX;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *plVar2;
  pointer ppVar3;
  initializer_list<unsigned_char> __l;
  complex<double> iq;
  bool called;
  result_type local_600;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  vector<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
  complex_bytes1;
  shared_count sStack_5b8;
  default_random_engine g;
  _Any_data local_5a8;
  code *local_598;
  code *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  char *local_570;
  undefined1 *local_568;
  undefined1 *local_560;
  char *local_558;
  char *local_550;
  normal_distribution<double> local_548;
  undefined **local_520;
  undefined1 local_518;
  undefined8 *local_510;
  char **local_508;
  encoder<signed_char> waver;
  demod_nrz zwave;
  
  zwave.fsk_demod.s1._M_value._0_8_ = 0xff0d55aa2233d6d2;
  zwave.fsk_demod.s1._M_value._8_4_ = 0x9f00ff00;
  __l._M_len = 0xc;
  __l._M_array = (iterator)&zwave;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&buffer,__l,(allocator_type *)&waver);
  vVar1 = wavingz::
          checksum<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  zwave.fsk_demod.s1._M_value[0] = vVar1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&buffer,(uchar *)&zwave);
  local_5a8._M_unused._M_object = &called;
  called = false;
  local_590 = std::
              _Function_handler<void_(unsigned_char_*,_unsigned_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp:124:26)>
              ::_M_invoke;
  local_598 = std::
              _Function_handler<void_(unsigned_char_*,_unsigned_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp:124:26)>
              ::_M_manager;
  local_5a8._8_8_ = &buffer;
  wavingz::demod::demod_nrz::demod_nrz
            (&zwave,0x1f4000,(function<void_(unsigned_char_*,_unsigned_char_*)> *)&local_5a8);
  std::_Function_base::~_Function_base((_Function_base *)&local_5a8);
  wavingz::encoder<signed_char>::encoder(&waver,2000000,40000,100.0);
  wavingz::encoder<signed_char>::operator()
            (&complex_bytes1,&waver,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,0.1);
  local_548._M_param._M_mean = 0.0;
  local_548._M_param._M_stddev = 1.0;
  local_548._M_saved = 0.0;
  g._M_x = 1;
  local_548._M_saved_available = false;
  for (ppVar3 = complex_bytes1.
                super__Vector_base<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar3 != complex_bytes1.
                super__Vector_base<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVar3 = ppVar3 + 1) {
    local_600 = std::normal_distribution<double>::operator()(&local_548,&g);
    plVar2 = &g;
    std::normal_distribution<double>::operator()(&local_548,&g);
    iq._M_value._8_8_ = extraout_RDX;
    iq._M_value._0_8_ = plVar2;
    wavingz::demod::demod_nrz::operator()(&zwave,iq);
  }
  local_558 = 
  "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp";
  local_550 = "";
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_558,0x8f);
  sStack_5b8.pi_ = (sp_counted_base *)0x0;
  local_508 = &local_578;
  local_578 = "called";
  local_570 = "";
  local_518 = 0;
  local_520 = &PTR__lazy_ostream_00116bc0;
  local_510 = &boost::unit_test::lazy_ostream::inst;
  local_588 = 
  "/workspace/llm4binary/github/license_c_cmakelists/baol[P]waving-z/test/wavingz-test.cpp";
  local_580 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_5b8);
  std::
  _Vector_base<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
  ::~_Vector_base(&complex_bytes1.
                   super__Vector_base<std::pair<signed_char,_signed_char>,_std::allocator<std::pair<signed_char,_signed_char>_>_>
                 );
  wavingz::encoder<signed_char>::~encoder(&waver);
  wavingz::demod::demod_nrz::~demod_nrz(&zwave);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_encode_decode_noise)
{

    std::vector<uint8_t> buffer = { 0xd2, 0xd6, 0x33, 0x22, 0xAA, 0x55, 13, 0xFF, 0x00, 0xFF, 0x00, 0x9f };
    buffer.push_back(wavingz::checksum(buffer.begin(), buffer.end()));

    bool called = false;
    auto wave_callback = [&](uint8_t* begin, uint8_t* end)
    {
        called = true;
        BOOST_CHECK(end-begin >= 13); // we may have some more noisy bytes in the end
        BOOST_CHECK_EQUAL_COLLECTIONS(begin, begin+begin[6], buffer.begin(), buffer.end());
    };

    wavingz::demod::demod_nrz zwave(2048000, wave_callback);
    wavingz::encoder<int8_t> waver(2000000, 40000, 100);
    auto complex_bytes1 = waver(buffer.begin(), buffer.end(), 0.1);

    std::default_random_engine g;
    std::normal_distribution<double> gaussian_noise(0.0, 1.0);

    for(auto pair: complex_bytes1)
    {
        zwave(std::complex<double>(0.1 * gaussian_noise(g) + 0.9 * double(pair.first)/127.0,
                                   0.1 * gaussian_noise(g) + 0.9 * double(pair.second)/127.0));
    }
    BOOST_CHECK(called);
}